

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

string * __thiscall
lest::to_string<Implicit,int>
          (string *__return_storage_ptr__,lest *this,Implicit *lhs,string *op,int *rhs)

{
  ostream *poVar1;
  ostringstream os;
  size_type *local_200;
  size_type local_1f0;
  undefined8 uStack_1e8;
  string local_1e0;
  int local_1bc;
  ForNonContainerNonPointer<Implicit,_std::string> local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  to_string<Implicit>(&local_1b8,(Implicit *)this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,*(char **)lhs,*(long *)(lhs + 2));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  local_1bc = *(int *)&(op->_M_dataplus)._M_p;
  make_value_string<int>(&local_1e0,&local_1bc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p == &local_1e0.field_2) {
    uStack_1e8 = local_1e0.field_2._8_8_;
    local_200 = &local_1f0;
  }
  else {
    local_200 = (size_type *)local_1e0._M_dataplus._M_p;
  }
  local_1f0 = local_1e0.field_2._M_allocated_capacity;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(char *)local_200,local_1e0._M_string_length);
  if (local_200 != &local_1f0) {
    operator_delete(local_200,local_1f0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::str();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p == &local_1e0.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         local_1e0.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_1e0.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_1e0._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         local_1e0.field_2._M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = local_1e0._M_string_length;
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

auto to_string( L const & lhs, std::string op, R const & rhs ) -> std::string
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}